

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O2

void Res_WinAddMissing(Res_Win_t *p)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  for (iVar2 = 0; iVar2 < p->vLeaves->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,iVar2);
    Abc_NodeSetTravIdCurrent(pAVar1);
  }
  for (iVar2 = 0; iVar2 < p->vNodes->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(p->vNodes,iVar2);
    Abc_NodeSetTravIdCurrent(pAVar1);
  }
  p->vBranches->nSize = 0;
  for (iVar2 = 0; iVar2 < p->vRoots->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,iVar2);
    Res_WinAddMissing_rec(p,pAVar1,p->nLevTravMin);
  }
  return;
}

Assistant:

void Res_WinAddMissing( Res_Win_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    // mark the leaves
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );        
    // mark the already collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );        
    // explore from the roots
    Vec_PtrClear( p->vBranches );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Res_WinAddMissing_rec( p, pObj, p->nLevTravMin );
}